

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::MemberAccessExpression::requireLValueImpl
          (MemberAccessExpression *this,ASTContext *context,SourceLocation location,
          bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix)

{
  SourceRange range;
  SourceRange sourceRange;
  string_view arg;
  string_view arg_00;
  SourceRange varRange;
  SourceLocation assignLoc;
  bool bVar1;
  VariableSymbol *pVVar2;
  Symbol *pSVar3;
  NetSymbol *pNVar4;
  MemberAccessExpression *in_RDI;
  Expression *in_stack_00000028;
  ASTContext *in_stack_00000030;
  Expression *in_stack_00000038;
  bitmask<slang::ast::AssignFlags> in_stack_00000047;
  SourceLocation in_stack_00000048;
  NetSymbol *net;
  Symbol *sym;
  Diagnostic *diag;
  VariableSymbol *var;
  Type *valueType;
  bitmask<slang::ast::VariableFlags> *in_stack_fffffffffffffec8;
  Diagnostic *in_stack_fffffffffffffed0;
  Scope *usageScope;
  SourceLocation in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  DiagCode in_stack_fffffffffffffee4;
  uint uVar5;
  SourceLocation in_stack_fffffffffffffee8;
  undefined4 uVar6;
  DiagCode code;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  ValueSymbol *in_stack_ffffffffffffff00;
  DiagCode code_00;
  ASTContext *in_stack_ffffffffffffff08;
  Diagnostic *in_stack_ffffffffffffff10;
  bitmask<slang::ast::AssignFlags> assignFlags;
  Expression *in_stack_ffffffffffffff18;
  size_t sVar7;
  char *in_stack_ffffffffffffff20;
  char *pcVar8;
  bitmask<slang::ast::VariableFlags> local_a2;
  undefined8 local_a0;
  VariableSymbol *in_stack_ffffffffffffff68;
  ASTContext *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  SourceLocation in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  bitmask<slang::ast::AssignFlags> flags_00;
  undefined8 in_stack_ffffffffffffff90;
  bool local_1;
  
  flags_00.m_bits = (underlying_type)((ulong)in_stack_ffffffffffffff90 >> 0x30);
  uVar6 = SUB84(in_RDI,0);
  code = SUB84((ulong)in_RDI >> 0x20,0);
  value(in_RDI);
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xf61b7e);
  Type::getCanonicalType((Type *)in_stack_fffffffffffffed0);
  bVar1 = Type::isClass((Type *)0xf61b9b);
  if (((bVar1) || (bVar1 = Type::isCovergroup((Type *)0xf61bac), bVar1)) ||
     (bVar1 = Type::isVoid((Type *)0xf61bbd), bVar1)) {
    assignFlags.m_bits = (underlying_type)((ulong)in_stack_ffffffffffffff10 >> 0x38);
    bVar1 = VariableSymbol::isKind(**(SymbolKind **)(CONCAT44(code,uVar6) + 0x30));
    if (bVar1) {
      Symbol::as<slang::ast::VariableSymbol>((Symbol *)0xf61c05);
      ASTContext::addDriver
                (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (Expression *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                 assignFlags);
      Symbol::as<slang::ast::VariableSymbol>((Symbol *)0xf61c5b);
      assignLoc._4_4_ = in_stack_ffffffffffffff8c;
      assignLoc._0_4_ = in_stack_ffffffffffffff88;
      varRange.startLoc._4_4_ = in_stack_ffffffffffffff7c;
      varRange.startLoc._0_4_ = in_stack_ffffffffffffff78;
      varRange.endLoc = in_stack_ffffffffffffff80;
      local_1 = ValueExpressionBase::checkVariableAssignment
                          (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,flags_00,assignLoc,
                           varRange);
    }
    else {
      bVar1 = SourceLocation::operator_cast_to_bool((SourceLocation *)0xf61ce0);
      if (!bVar1) {
        SourceRange::start((SourceRange *)(CONCAT44(code,uVar6) + 0x20));
      }
      ASTContext::addDiag((ASTContext *)
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),code,
                          in_stack_fffffffffffffee8);
      Diagnostic::addNote(in_stack_fffffffffffffed0,in_stack_fffffffffffffee4,
                          in_stack_fffffffffffffed8);
      local_a0 = *(undefined8 *)(CONCAT44(code,uVar6) + 0x20);
      range.endLoc._0_4_ = in_stack_fffffffffffffee0;
      range.startLoc = in_stack_fffffffffffffed8;
      range.endLoc._4_2_ = in_stack_fffffffffffffee4.subsystem;
      range.endLoc._6_2_ = in_stack_fffffffffffffee4.code;
      Diagnostic::operator<<(in_stack_fffffffffffffed0,range);
      local_1 = false;
    }
  }
  else {
    bVar1 = VariableSymbol::isKind(**(SymbolKind **)(CONCAT44(code,uVar6) + 0x30));
    code_00 = SUB84((ulong)in_stack_ffffffffffffff00 >> 0x20,0);
    uVar5 = (uint)in_stack_fffffffffffffee4 & 0xffffff;
    if (bVar1) {
      pVVar2 = Symbol::as<slang::ast::VariableSymbol>((Symbol *)0xf61e00);
      pSVar3 = (Symbol *)&pVVar2->flags;
      bitmask<slang::ast::VariableFlags>::bitmask(&local_a2,ImmutableCoverageOption);
      bVar1 = bitmask<slang::ast::VariableFlags>::has
                        ((bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffed0,
                         in_stack_fffffffffffffec8);
      uVar5 = uVar5 & 0xffffff;
      if (bVar1) {
        usageScope = *(Scope **)(CONCAT44(code,uVar6) + 0x30);
        not_null<const_slang::ast::Scope_*>::operator*
                  ((not_null<const_slang::ast::Scope_*> *)0xf61e59);
        bVar1 = isWithinCovergroup(pSVar3,usageScope);
        uVar5 = CONCAT13(bVar1,(int3)uVar5) ^ 0xff000000;
      }
    }
    if ((uVar5 & 0x1000000) == 0) {
      value((MemberAccessExpression *)CONCAT44(code,uVar6));
      pSVar3 = Expression::getSymbolReference
                         (in_stack_ffffffffffffff18,
                          SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0));
      if (((pSVar3 != (Symbol *)0x0) && (pSVar3->kind == Net)) &&
         (pNVar4 = Symbol::as<slang::ast::NetSymbol>((Symbol *)0xf61f2f),
         pNVar4->netType->netKind == UserDefined)) {
        sVar7 = *(size_t *)(CONCAT44(code,uVar6) + 0x20);
        pcVar8 = *(char **)(CONCAT44(code,uVar6) + 0x28);
        sourceRange.startLoc._4_2_ = code.subsystem;
        sourceRange.startLoc._6_2_ = code.code;
        sourceRange.startLoc._0_4_ = uVar6;
        sourceRange.endLoc._0_7_ = in_stack_fffffffffffffef8;
        sourceRange.endLoc._7_1_ = in_stack_fffffffffffffeff;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffee8,code_00,sourceRange);
        arg_00._M_str = pcVar8;
        arg_00._M_len = sVar7;
        Diagnostic::operator<<
                  ((Diagnostic *)(pNVar4->super_ValueSymbol).super_Symbol.name._M_str,arg_00);
      }
      value((MemberAccessExpression *)CONCAT44(code,uVar6));
      local_1 = Expression::requireLValue
                          (in_stack_00000038,in_stack_00000030,in_stack_00000048,in_stack_00000047,
                           in_stack_00000028);
    }
    else {
      ASTContext::addDiag((ASTContext *)CONCAT44(uVar5,in_stack_fffffffffffffee0),code,
                          in_stack_fffffffffffffee8);
      arg._M_str = in_stack_ffffffffffffff20;
      arg._M_len = (size_t)in_stack_ffffffffffffff18;
      Diagnostic::operator<<(in_stack_ffffffffffffff10,arg);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool MemberAccessExpression::requireLValueImpl(const ASTContext& context, SourceLocation location,
                                               bitmask<AssignFlags> flags,
                                               const Expression* longestStaticPrefix) const {
    // If this is a selection of a class or covergroup member, assignability depends only
    // on the selected member and not on the handle itself. Otherwise, the opposite is true.
    auto& valueType = value().type->getCanonicalType();
    if (valueType.isClass() || valueType.isCovergroup() || valueType.isVoid()) {
        if (VariableSymbol::isKind(member.kind)) {
            if (!longestStaticPrefix)
                longestStaticPrefix = this;

            auto& var = member.as<VariableSymbol>();
            context.addDriver(var, *longestStaticPrefix, flags);

            return ValueExpressionBase::checkVariableAssignment(context,
                                                                member.as<VariableSymbol>(), flags,
                                                                location, sourceRange);
        }

        if (!location)
            location = sourceRange.start();

        auto& diag = context.addDiag(diag::ExpressionNotAssignable, location);
        diag.addNote(diag::NoteDeclarationHere, member.location);
        diag << sourceRange;
        return false;
    }

    if (VariableSymbol::isKind(member.kind) &&
        member.as<VariableSymbol>().flags.has(VariableFlags::ImmutableCoverageOption) &&
        !isWithinCovergroup(member, *context.scope)) {
        context.addDiag(diag::CoverOptionImmutable, location) << member.name;
        return false;
    }

    if (auto sym = value().getSymbolReference(); sym && sym->kind == SymbolKind::Net) {
        auto& net = sym->as<NetSymbol>();
        if (net.netType.netKind == NetType::UserDefined)
            context.addDiag(diag::UserDefPartialDriver, sourceRange) << net.name;
    }

    if (!longestStaticPrefix)
        longestStaticPrefix = this;

    return value().requireLValue(context, location, flags, longestStaticPrefix);
}